

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9VmOutputConsumeAp(jx9_vm *pVm,char *zFormat,__va_list_tag *ap)

{
  undefined1 local_50 [8];
  SyBlob sWorker;
  sxi32 rc;
  jx9_output_consumer *pCons;
  __va_list_tag *ap_local;
  char *zFormat_local;
  jx9_vm *pVm_local;
  
  sWorker._28_4_ = 0;
  SyBlobInit((SyBlob *)local_50,&pVm->sAllocator);
  SyBlobFormatAp((SyBlob *)local_50,zFormat,ap);
  if ((uint)sWorker.pBlob != 0) {
    sWorker._28_4_ =
         (*(pVm->sVmConsumer).xConsumer)
                   (sWorker.pAllocator,(uint)sWorker.pBlob,(pVm->sVmConsumer).pUserData);
  }
  pVm->nOutputLen = (uint)sWorker.pBlob + pVm->nOutputLen;
  SyBlobRelease((SyBlob *)local_50);
  return sWorker._28_4_;
}

Assistant:

JX9_PRIVATE sxi32 jx9VmOutputConsumeAp(
	jx9_vm *pVm,         /* Target VM */
	const char *zFormat, /* Formatted message to output */
	va_list ap           /* Variable list of arguments */ 
	)
{
	jx9_output_consumer *pCons = &pVm->sVmConsumer;
	sxi32 rc = SXRET_OK;
	SyBlob sWorker;
	/* Format the message and call the output consumer */
	SyBlobInit(&sWorker, &pVm->sAllocator);
	SyBlobFormatAp(&sWorker, zFormat, ap);
	if( SyBlobLength(&sWorker) > 0 ){
		/* Consume the formatted message */
		rc = pCons->xConsumer(SyBlobData(&sWorker), SyBlobLength(&sWorker), pCons->pUserData);
	}
	/* Increment output length */
	pVm->nOutputLen += SyBlobLength(&sWorker);
	/* Release the working buffer */
	SyBlobRelease(&sWorker);
	return rc;
}